

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMatrixUtil.cpp
# Opt level: O3

void ZXing::QRCode::BuildMatrix
               (BitArray *dataBits,ErrorCorrectionLevel ecLevel,Version *version,int maskPattern,
               TritMatrix *matrix)

{
  char cVar1;
  uint *puVar2;
  uint *puVar3;
  pointer puVar4;
  int iVar5;
  uint *puVar6;
  invalid_argument *piVar7;
  logic_error *plVar8;
  undefined4 in_register_0000000c;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  uint uVar17;
  pointer pTVar18;
  ulong uVar19;
  ulong uVar20;
  pointer pTVar21;
  value_t vVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  uint *puVar26;
  undefined8 *puVar27;
  int x;
  uint uVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  BitArray *pBVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  BitArray maskBits;
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined8 local_d8;
  BitArray *local_d0;
  long local_c8;
  string local_c0;
  uint local_a0;
  int local_9c;
  long local_98;
  pointer local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  pointer local_70;
  ulong local_68;
  long local_60;
  ulong local_58;
  string local_50;
  
  local_d8 = CONCAT44(in_register_0000000c,maskPattern);
  local_c8 = CONCAT44(local_c8._4_4_,ecLevel);
  pTVar21 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
            super__Vector_impl_data._M_start;
  pTVar18 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_d0 = dataBits;
  if (pTVar21 != pTVar18) {
    memset(pTVar21,2,(long)pTVar18 - (long)pTVar21);
  }
  EmbedPositionDetectionPattern(0,0,matrix);
  EmbedPositionDetectionPattern(matrix->_width + -7,0,matrix);
  EmbedPositionDetectionPattern(0,matrix->_width + -7,matrix);
  (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
  super__Vector_impl_data._M_start[(long)matrix->_width * ((long)matrix->_height + -8) + 8].value =
       true_v;
  if (1 < version->_versionNumber) {
    puVar3 = (uint *)(version->_alignmentPatternCenters).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_finish;
    puVar2 = (uint *)(version->_alignmentPatternCenters).
                     super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                     _M_start;
    for (puVar6 = puVar2; puVar6 != puVar3; puVar6 = puVar6 + 1) {
      uVar14 = *puVar6;
      iVar5 = matrix->_width;
      iVar25 = matrix->_height;
      puVar26 = puVar2;
      do {
        uVar31 = *puVar26;
        if ((uVar31 ^ 6) != 0 || (uVar14 ^ 6) != 0) {
          if (((uVar31 ^ 6) != 0 || iVar25 - 7U != uVar14) &&
             (uVar31 != iVar5 - 7U || (uVar14 ^ 6) != 0)) {
            pTVar21 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            iVar13 = uVar31 + (uVar14 - 2) * iVar5 + -2;
            iVar30 = 0;
            do {
              uVar28 = iVar30 - 2;
              uVar31 = -uVar28;
              if (0 < (int)uVar28) {
                uVar31 = uVar28;
              }
              lVar29 = 0;
              do {
                uVar32 = (int)lVar29 - 2;
                uVar28 = -uVar32;
                if (0 < (int)uVar32) {
                  uVar28 = uVar32;
                }
                if (uVar28 <= uVar31) {
                  uVar28 = uVar31;
                }
                pTVar21[iVar13 + (int)lVar29].value = uVar28 != 1;
                lVar29 = lVar29 + 1;
              } while (lVar29 != 5);
              iVar30 = iVar30 + 1;
              iVar13 = iVar13 + iVar5;
            } while (iVar30 != 5);
          }
        }
        puVar26 = puVar26 + 1;
      } while (puVar26 != puVar3);
    }
  }
  uVar14 = matrix->_width;
  lVar29 = (long)(int)uVar14;
  if (0x10 < lVar29) {
    pTVar21 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
              super__Vector_impl_data._M_start;
    pTVar18 = pTVar21 + lVar29 * 8 + 6;
    uVar20 = 8;
    do {
      vVar22 = ~(byte)uVar20 & true_v;
      pTVar21[uVar20 + (ulong)uVar14 * 6].value = vVar22;
      uVar20 = uVar20 + 1;
      pTVar18->value = vVar22;
      pTVar18 = pTVar18 + lVar29;
    } while (uVar14 - 8 != uVar20);
  }
  if (7 < (uint)local_d8) {
    piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar7,"Invalid mask pattern");
LAB_0018de28:
    __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_138._M_dataplus._M_p = (pointer)0x0;
  local_138._M_string_length = 0;
  local_138.field_2._M_allocated_capacity = 0;
  iVar5 = BitsFromECLevel((ErrorCorrectionLevel)local_c8);
  uVar14 = (int)local_d8 + iVar5 * 8;
  uVar31 = 4;
  do {
    local_118._M_dataplus._M_p._0_1_ = (uVar14 >> (uVar31 & 0x1f) & 1) != 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,
               (uchar *)&local_118);
    bVar34 = uVar31 != 0;
    uVar31 = uVar31 - 1;
  } while (bVar34);
  uVar14 = uVar14 * 0x400;
  if (uVar14 == 0) {
    uVar14 = 0;
  }
  else {
    uVar31 = 0x1f;
    if (uVar14 != 0) {
      for (; uVar14 >> uVar31 == 0; uVar31 = uVar31 - 1) {
      }
    }
    uVar31 = uVar31 ^ 0x1f;
    do {
      uVar14 = 0x537 << (0x15U - (char)uVar31 & 0x1f) ^ uVar14;
      if (uVar14 == 0) {
        uVar31 = 0;
      }
      else {
        uVar31 = 0x1f;
        if (uVar14 != 0) {
          for (; uVar14 >> uVar31 == 0; uVar31 = uVar31 - 1) {
          }
        }
        uVar31 = uVar31 ^ 0x1f;
      }
    } while (0x3ff < uVar14);
  }
  uVar31 = 9;
  do {
    local_118._M_dataplus._M_p._0_1_ = (uVar14 >> (uVar31 & 0x1f) & 1) != 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_138,
               (uchar *)&local_118);
    bVar34 = uVar31 != 0;
    uVar31 = uVar31 - 1;
  } while (bVar34);
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  uVar14 = 0xe;
  do {
    local_118._M_dataplus._M_p._0_1_ = (0x5412U >> (uVar14 & 0x1f) & 1) != 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
               (uchar *)&local_118);
    bVar34 = uVar14 != 0;
    uVar14 = uVar14 - 1;
  } while (bVar34);
  BitArray::bitwiseXOR((BitArray *)&local_138,(BitArray *)&local_f8);
  uVar20 = local_138._M_string_length - (long)local_138._M_dataplus._M_p;
  if ((int)uVar20 != 0xf) {
    plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string
              (&local_c0,(int)local_138._M_string_length - (int)local_138._M_dataplus._M_p);
    std::operator+(&local_118,"Should not happen but we got: ",&local_c0);
    std::logic_error::logic_error(plVar8,(string *)&local_118);
    __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  if (local_f8._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_f8._M_dataplus._M_p,
                    local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
    uVar20 = local_138._M_string_length - (long)local_138._M_dataplus._M_p;
  }
  if ((int)(uint)uVar20 < 1) {
    if (local_138._M_dataplus._M_p == (pointer)0x0) goto LAB_0018d872;
  }
  else {
    iVar5 = matrix->_width;
    pTVar21 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar24 = (ulong)((uint)uVar20 & 0x7fffffff) - 1;
    iVar13 = (matrix->_height + -0xf) * iVar5;
    iVar25 = iVar5 * 9;
    puVar27 = &DAT_001a0fc0;
    uVar15 = 0;
    uVar19 = uVar24;
    do {
      iVar25 = iVar25 + -1;
      if (uVar20 <= uVar24) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      iVar30 = iVar13;
      if (7 >= uVar15) {
        iVar30 = iVar25;
      }
      cVar1 = local_138._M_dataplus._M_p[uVar19];
      pTVar21[(int)((ulong)*puVar27 >> 0x20) * iVar5 + (int)*puVar27].value = cVar1 != '\0';
      pTVar21[(long)iVar30 + (ulong)(7 < uVar15) * 8].value = cVar1 != '\0';
      uVar15 = uVar15 + 1;
      iVar13 = iVar13 + iVar5;
      puVar27 = puVar27 + 1;
      bVar34 = uVar19 != 0;
      uVar19 = uVar19 - 1;
    } while (bVar34);
  }
  operator_delete(local_138._M_dataplus._M_p,
                  local_138.field_2._M_allocated_capacity - (long)local_138._M_dataplus._M_p);
LAB_0018d872:
  pBVar33 = local_d0;
  uVar14 = version->_versionNumber;
  if (6 < (int)uVar14) {
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
    local_f8.field_2._M_allocated_capacity = 0;
    uVar31 = 5;
    do {
      local_118._M_dataplus._M_p._0_1_ = (uVar14 >> (uVar31 & 0x1f) & 1) != 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
                 (uchar *)&local_118);
      bVar34 = uVar31 != 0;
      uVar31 = uVar31 - 1;
    } while (bVar34);
    uVar14 = version->_versionNumber << 0xc;
    if (uVar14 == 0) {
      uVar14 = 0;
    }
    else {
      uVar31 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar31 == 0; uVar31 = uVar31 - 1) {
        }
      }
      uVar31 = uVar31 ^ 0x1f;
      do {
        uVar14 = 0x1f25 << (0x13U - (char)uVar31 & 0x1f) ^ uVar14;
        if (uVar14 == 0) {
          uVar31 = 0;
        }
        else {
          uVar31 = 0x1f;
          if (uVar14 != 0) {
            for (; uVar14 >> uVar31 == 0; uVar31 = uVar31 - 1) {
            }
          }
          uVar31 = uVar31 ^ 0x1f;
        }
      } while (0xfff < uVar14);
    }
    uVar31 = 0xb;
    do {
      local_118._M_dataplus._M_p._0_1_ = (uVar14 >> (uVar31 & 0x1f) & 1) != 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_f8,
                 (uchar *)&local_118);
      bVar34 = uVar31 != 0;
      uVar31 = uVar31 - 1;
    } while (bVar34);
    if ((int)(local_f8._M_string_length - (long)local_f8._M_dataplus._M_p) != 0x12) {
      plVar8 = (logic_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string
                (&local_c0,(int)local_f8._M_string_length - (int)local_f8._M_dataplus._M_p);
      std::operator+(&local_118,"Should not happen but we got: ",&local_c0);
      std::logic_error::logic_error(plVar8,(string *)&local_118);
      __cxa_throw(plVar8,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    iVar5 = 0;
    uVar20 = 0x11;
    do {
      iVar25 = matrix->_width;
      iVar13 = matrix->_height;
      pTVar21 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>.
                _M_impl.super__Vector_impl_data._M_start;
      iVar30 = (iVar13 + -0xb) * iVar25 + iVar5;
      lVar29 = 0;
      uVar19 = (long)(int)uVar20;
      do {
        if (local_f8._M_string_length - (long)local_f8._M_dataplus._M_p <= uVar19) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        uVar20 = uVar19 - 1;
        cVar1 = local_f8._M_dataplus._M_p[uVar19];
        pTVar21[iVar30].value = cVar1 != '\0';
        pTVar21[iVar25 * iVar5 + iVar13 + -0xb + (int)lVar29].value = cVar1 != '\0';
        lVar29 = lVar29 + 1;
        iVar30 = iVar30 + iVar25;
        uVar19 = uVar20;
      } while (lVar29 != 3);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 6);
    operator_delete(local_f8._M_dataplus._M_p,
                    local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
  }
  local_98 = (long)matrix->_width;
  uVar20 = 0;
  if (1 < local_98) {
    iVar5 = matrix->_height;
    uVar14 = matrix->_width - 1;
    uVar28 = iVar5 - 1;
    local_90 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl
               .super__Vector_impl_data._M_start;
    uVar20 = 0;
    uVar31 = 0xffffffff;
    do {
      uVar32 = uVar14;
      if (uVar14 == 6) {
        uVar32 = 5;
      }
      uVar19 = (ulong)uVar32;
      if ((int)uVar28 < iVar5 && -1 < (int)uVar28) {
        uVar16 = (ulong)uVar32;
        local_c8 = (long)(int)uVar31;
        local_78 = (ulong)(uint)((int)uVar32 / 3);
        uVar14 = uVar32 - 1;
        uVar24 = (ulong)uVar14;
        local_80 = (ulong)(uint)((int)uVar14 / 3);
        uVar10 = (ulong)uVar31;
        iVar13 = uVar32 * uVar28;
        local_9c = uVar32 * uVar31;
        iVar25 = uVar28 * uVar14;
        local_58 = (ulong)(uVar14 * uVar31);
        pTVar21 = local_90 + local_98 * (ulong)uVar28 + uVar16;
        local_60 = local_98 * local_c8;
        lVar9 = 0;
        lVar29 = local_c8;
        uVar15 = uVar16;
        do {
          puVar4 = (pBVar33->_bits).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar11 = (long)(pBVar33->_bits).
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)puVar4;
          uVar17 = uVar28 + (int)lVar9;
          uVar23 = uVar17 >> 1;
          bVar34 = (uVar17 & 1) == 0;
          local_a0 = uVar31;
          local_88 = uVar19;
          if (pTVar21->value != empty_v) goto LAB_0018dc4e;
          iVar30 = (int)uVar20;
          local_70 = puVar4;
          local_68 = uVar20;
          if (iVar30 < (int)uVar11) {
            if (uVar11 <= (ulong)(long)iVar30) goto LAB_0018ddfe;
            bVar36 = puVar4[iVar30] != '\0';
          }
          else {
            bVar36 = false;
          }
          bVar35 = bVar34;
          switch((int)local_d8) {
          case 0:
            uVar17 = uVar28 + (int)uVar15;
            goto LAB_0018dc2b;
          case 1:
            break;
          case 2:
            bVar35 = uVar32 * -0x55555555 + 0x2aaaaaaa < 0x55555555;
            break;
          case 3:
            bVar35 = (uVar28 + (int)uVar16) * -0x55555555 + 0x2aaaaaaa < 0x55555555;
            break;
          case 4:
            uVar17 = (int)uVar32 / 3 + uVar23;
            goto LAB_0018dc2b;
          case 5:
            uVar17 = iVar13 * -0x55555555 + 0x2aaaaaaa;
            bVar35 = (uVar17 >> 1 | (uint)((uVar17 & 1) != 0) << 0x1f) < 0x2aaaaaab;
            break;
          case 6:
            bVar35 = iVar13 % 6 < 3;
            break;
          case 7:
            uVar17 = iVar13 % 3 + uVar28 + (int)uVar16;
LAB_0018dc2b:
            bVar35 = (uVar17 & 1) == 0;
            break;
          case -1:
            goto switchD_0018db83_caseD_ffffffff;
          default:
            goto switchD_0018db83_default;
          }
          bVar36 = (bool)(bVar36 ^ bVar35);
switchD_0018db83_caseD_ffffffff:
          uVar20 = (ulong)(iVar30 + 1);
          pTVar21->value = bVar36;
          pBVar33 = local_d0;
LAB_0018dc4e:
          if (pTVar21[-1].value == empty_v) {
            iVar30 = (int)uVar20;
            if (iVar30 < (int)uVar11) {
              if (uVar11 <= (ulong)(long)iVar30) {
LAB_0018ddfe:
                std::__throw_out_of_range_fmt
                          (
                          "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                          );
              }
              bVar36 = puVar4[iVar30] != '\0';
            }
            else {
              bVar36 = false;
            }
            switch((int)local_d8) {
            case 0:
              bVar34 = ((uVar28 + (int)uVar15) - 1 & 1) == 0;
              break;
            case 1:
              break;
            case 2:
              bVar34 = uVar32 * -0x55555555 + 0x7fffffff < 0x55555555;
              break;
            case 3:
              bVar34 = (uVar28 + (int)uVar24) * -0x55555555 + 0x2aaaaaaa < 0x55555555;
              break;
            case 4:
              bVar34 = (uVar23 + (int)uVar14 / 3 & 1) == 0;
              break;
            case 5:
              uVar17 = iVar25 * -0x55555555 + 0x2aaaaaaa;
              bVar34 = (uVar17 >> 1 | (uint)((uVar17 & 1) != 0) << 0x1f) < 0x2aaaaaab;
              break;
            case 6:
              bVar34 = iVar25 % 6 < 3;
              break;
            case 7:
              bVar34 = (iVar25 % 3 + uVar28 + (int)uVar24 & 1) == 0;
              break;
            case -1:
              goto switchD_0018dc95_caseD_ffffffff;
            default:
switchD_0018db83_default:
              piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
              std::invalid_argument::invalid_argument(piVar7,"QRCode maskIndex out of range");
              goto LAB_0018de28;
            }
            bVar36 = (bool)(bVar36 ^ bVar34);
switchD_0018dc95_caseD_ffffffff:
            uVar20 = (ulong)(iVar30 + 1);
            pTVar21[-1].value = bVar36;
          }
          lVar9 = lVar9 + uVar10;
          lVar12 = (ulong)uVar28 + lVar29;
          if (lVar12 < 0) break;
          uVar16 = uVar16 + uVar10;
          iVar13 = iVar13 + local_9c;
          uVar15 = uVar15 + local_c8;
          uVar24 = uVar24 + uVar10;
          iVar25 = iVar25 + uVar14 * uVar31;
          lVar29 = lVar29 + local_c8;
          pTVar21 = pTVar21 + local_60;
        } while (lVar12 < iVar5);
        uVar28 = uVar28 + (int)lVar9;
      }
      uVar28 = uVar28 - uVar31;
      uVar31 = -uVar31;
      uVar14 = uVar32 - 2;
    } while (2 < (int)uVar32);
  }
  if (*(int *)&(pBVar33->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
      *(int *)&(pBVar33->_bits).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start <= (int)uVar20) {
    return;
  }
  piVar7 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_138,(int)uVar20);
  std::operator+(&local_f8,"Not all bits consumed: ",&local_138);
  std::operator+(&local_c0,&local_f8,'/');
  std::__cxx11::to_string
            (&local_50,
             *(int *)&(local_d0->_bits).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish -
             *(int *)&(local_d0->_bits).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::operator+(&local_118,&local_c0,&local_50);
  std::invalid_argument::invalid_argument(piVar7,(string *)&local_118);
  __cxa_throw(piVar7,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void BuildMatrix(const BitArray& dataBits, ErrorCorrectionLevel ecLevel, const Version& version, int maskPattern, TritMatrix& matrix)
{
	matrix.clear();
	// Let's get started with embedding big squares at corners.
	EmbedPositionDetectionPatternsAndSeparators(matrix);
	// Then, embed the dark dot at the left bottom corner.
	EmbedDarkDotAtLeftBottomCorner(matrix);
	// Position adjustment patterns appear if version >= 2.
	EmbedPositionAdjustmentPatterns(version, matrix);
	// Timing patterns should be embedded after position adj. patterns.
	EmbedTimingPatterns(matrix);
	// Type information appear with any version.
	EmbedTypeInfo(ecLevel, maskPattern, matrix);
	// Version info appear if version >= 7.
	EmbedVersionInfo(version, matrix);
	// Data should be embedded at end.
	EmbedDataBits(dataBits, maskPattern, matrix);
}